

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O0

void printtypeinfo(rnntypeinfo *ti,char *prefix,int shift,char *file)

{
  int local_2c;
  int i;
  char *file_local;
  int shift_local;
  char *prefix_local;
  rnntypeinfo *ti_local;
  
  if (ti->shr != 0) {
    printdef(prefix,"SHR",1,(long)ti->shr,file);
  }
  if (ti->minvalid != 0) {
    printdef(prefix,"MIN",0,ti->min,file);
  }
  if (ti->maxvalid != 0) {
    printdef(prefix,"MAX",0,ti->max,file);
  }
  if (ti->alignvalid != 0) {
    printdef(prefix,"ALIGN",0,ti->align,file);
  }
  if (ti->radixvalid != 0) {
    printdef(prefix,"RADIX",0,ti->radix,file);
  }
  for (local_2c = 0; local_2c < ti->valsnum; local_2c = local_2c + 1) {
    printvalue(ti->vals[local_2c],shift);
  }
  for (local_2c = 0; local_2c < ti->bitfieldsnum; local_2c = local_2c + 1) {
    printbitfield(ti->bitfields[local_2c],shift);
  }
  return;
}

Assistant:

void printtypeinfo (struct rnntypeinfo *ti, char *prefix, int shift, char *file) {
	if (ti->shr)
		printdef (prefix, "SHR", 1, ti->shr, file);
	if (ti->minvalid)
		printdef (prefix, "MIN", 0, ti->min, file);
	if (ti->maxvalid)
		printdef (prefix, "MAX", 0, ti->max, file);
	if (ti->alignvalid)
		printdef (prefix, "ALIGN", 0, ti->align, file);
	if (ti->radixvalid)
		printdef (prefix, "RADIX", 0, ti->radix, file);
	int i;
	for (i = 0; i < ti->valsnum; i++)
		printvalue(ti->vals[i], shift);
	for (i = 0; i < ti->bitfieldsnum; i++)
		printbitfield(ti->bitfields[i], shift);
}